

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O1

Rational * __thiscall
Polynom<Rational>::valueAt(Rational *__return_storage_ptr__,Polynom<Rational> *this,Rational *a)

{
  long lVar1;
  ulong uVar2;
  
  BigInteger::BigInteger(&__return_storage_ptr__->_numerator,0);
  BigInteger::BigInteger(&__return_storage_ptr__->_denominator,1);
  if ((this->m).N != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      Rational::operator*=(__return_storage_ptr__,a);
      Rational::operator+=
                (__return_storage_ptr__,
                 (Rational *)
                 ((long)&(((this->m).arr)->_numerator).digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x40;
    } while (uVar2 < (this->m).N);
  }
  return __return_storage_ptr__;
}

Assistant:

const Field Polynom<Field>::valueAt(Field a) const
{
    Field res = 0;
    for(unsigned i = 0; i < m.width(); ++i)
    {
        res *= a;
        res += m[0][i];
    }
    return res;
}